

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O2

string * __thiscall
google::protobuf::StrCat_abi_cxx11_(string *__return_storage_ptr__,protobuf *this,AlphaNum *a)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

inline string StrCat(const AlphaNum& a) { return string(a.data(), a.size()); }